

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cc
# Opt level: O0

StatusOr<security::pawn::Pci> security::pawn::Pci::Create(void)

{
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  anon_union_8_1_1246618d_for_StatusOrData<security::pawn::Pci>_1 in_RDI;
  string_view message;
  StatusOr<security::pawn::Pci> SVar3;
  Pci local_29;
  undefined1 auStack_28 [7];
  Pci pci;
  Status local_18 [2];
  
  iVar1 = iopl(3);
  if (iVar1 == 0) {
    Pci(&local_29);
    local_29.iopl_done_ = true;
    absl::StatusOr<security::pawn::Pci>::StatusOr<security::pawn::Pci,_0>
              ((StatusOr<security::pawn::Pci> *)in_RDI,&local_29);
    ~Pci(&local_29);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,
               "Failed to acquire I/O privileges. Make sure this process runs as root and/or has CAP_SYS_RAWIO."
              );
    message._M_str = _auStack_28;
    message._M_len = (size_t)local_18;
    absl::FailedPreconditionError(message);
    absl::StatusOr<security::pawn::Pci>::StatusOr<absl::Status,_0>
              ((StatusOr<security::pawn::Pci> *)in_RDI,local_18);
    absl::Status::~Status(local_18);
    uVar2 = extraout_RDX;
  }
  SVar3.super_StatusOrData<security::pawn::Pci>._8_8_ = uVar2;
  SVar3.super_StatusOrData<security::pawn::Pci>.field_0 = in_RDI;
  return (StatusOr<security::pawn::Pci>)SVar3.super_StatusOrData<security::pawn::Pci>;
}

Assistant:

absl::StatusOr<Pci> Pci::Create() {
  // Note: This will not work on Windows, since there is no official API that
  //       allows to do this. A small kernel driver is needed there.
  if (iopl(3 /* Request ring 3 access to all I/O ports. */) !=
      0 /* Success */) {
    return absl::FailedPreconditionError(
        "Failed to acquire I/O privileges. Make sure this "
        "process runs as root and/or has CAP_SYS_RAWIO.");
  }

  Pci pci;
  pci.iopl_done_ = true;
  return std::move(pci);  // GCC 7 needs the extra move
}